

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::makeTypeUse
          (Result<wasm::Ok> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *this,Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::HeapTypeT>
          param_2,ParamsT *params,ResultsT *results)

{
  ulong uVar1;
  Signature sig;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_wasm::HeapType>,_false,_true>,_bool>
  pVar5;
  Err local_f8;
  string local_d8;
  Type local_b8;
  Type local_b0;
  Index local_a8;
  undefined4 uStack_a4;
  HeapType type;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_90;
  undefined1 auStack_78 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> paramTypes;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> resultTypes;
  allocator<char> local_31;
  
  auStack_78 = (undefined1  [8])0x0;
  paramTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  paramTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (params != (ParamsT *)0x0) {
    getUnnamedTypes((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff58,
                    params);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_move_assign
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78,
               (_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff58);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff58);
  }
  auStack_58 = (undefined1  [8])0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultTypes.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (results != (ResultsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,results);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff58,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_90,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
  lVar4 = 0;
  do {
    if (lVar4 == 0x30) {
LAB_00c3746f:
      lVar3 = 0x18;
      do {
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                   ((long)&stack0xffffffffffffff58 + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      if (lVar4 == 0x30) {
        wasm::Type::Type(&local_b8,(Tuple *)auStack_78);
        wasm::Type::Type(&local_b0,(Tuple *)auStack_58);
        sig.results.id = local_b0.id;
        sig.params.id = local_b8.id;
        _local_a8 = local_b8.id;
        type.id = local_b0.id;
        pVar5 = std::
                _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::pair<wasm::Signature_const,wasm::HeapType>>
                          ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->sigTypes);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          HeapType::HeapType((HeapType *)&stack0xffffffffffffff58,sig);
          *(uintptr_t *)
           ((long)pVar5.first.
                  super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
           + 0x18) = _local_a8;
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                    (this->types,(value_type *)&stack0xffffffffffffff58);
        }
        local_a8 = pos;
        type.id = *(uintptr_t *)
                   ((long)pVar5.first.
                          super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_wasm::Signature,_wasm::HeapType>,_true>
                   + 0x18);
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::HeapType>,std::allocator<std::pair<unsigned_int_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_int_const,wasm::HeapType>>(this->implicitTypes);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
      return __return_storage_ptr__;
    }
    puVar2 = *(ulong **)((long)&stack0xffffffffffffff58 + lVar4);
    while (puVar2 != *(ulong **)((long)&type.id + lVar4)) {
      uVar1 = *puVar2;
      if ((uVar1 < 2) || (puVar2 = puVar2 + 1, (uVar1 & 1) != 0 && 6 < uVar1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"tuple types not allowed in signature",&local_31);
        Lexer::err(&local_f8,&this->in,&local_d8);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d8);
        goto LAB_00c3746f;
      }
    }
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT>,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Type> paramTypes;
    if (params) {
      paramTypes = getUnnamedTypes(*params);
    }

    std::vector<Type> resultTypes;
    if (results) {
      resultTypes = *results;
    }

    for (auto& v : {paramTypes, resultTypes}) {
      for (auto t : v) {
        if (!t.isSingle()) {
          return in.err("tuple types not allowed in signature");
        }
      }
    }

    auto sig = Signature(Type(paramTypes), Type(resultTypes));
    auto [it, inserted] = sigTypes.insert({sig, HeapType(HeapType::func)});
    if (inserted) {
      auto type = HeapType(sig);
      it->second = type;
      types.push_back(type);
    }
    implicitTypes.insert({pos, it->second});

    return Ok{};
  }